

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<long,char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,long *params,char (*params_1) [3])

{
  ArrayPtr<const_char> local_50;
  CappedArray<char,_26UL> local_40;
  
  toCharSequence<long>(&local_40,(long *)this);
  local_50 = toCharSequence<char_const(&)[3]>((char (*) [3])params);
  _::concat<kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_40,(CappedArray<char,_26UL> *)&local_50,&local_50);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}